

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  int iVar1;
  undefined1 local_338 [8];
  coda_cursor sub_cursor;
  coda_mem_type *type;
  int64_t *bit_size_local;
  coda_cursor *cursor_local;
  
  sub_cursor.stack[0x1f].bit_offset = (int64_t)cursor->stack[cursor->n + -1].type;
  if (((coda_dynamic_type_struct *)(sub_cursor.stack[0x1f].bit_offset + 0x10))->backend == 3) {
    memcpy(local_338,cursor,0x310);
    iVar1 = coda_cursor_use_base_type_of_special_type((coda_cursor *)local_338);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = coda_cursor_get_bit_size((coda_cursor *)local_338,bit_size);
    return iVar1;
  }
  if (((coda_dynamic_type_struct *)(sub_cursor.stack[0x1f].bit_offset + 0x10))->backend == 2) {
    if (((coda_dynamic_type_struct *)sub_cursor.stack[0x1f].bit_offset)->definition->format ==
        coda_format_ascii) {
      iVar1 = coda_ascii_cursor_get_bit_size(cursor,bit_size);
      if (iVar1 != 0) {
        return -1;
      }
    }
    else {
      iVar1 = coda_bin_cursor_get_bit_size(cursor,bit_size);
      if (iVar1 != 0) {
        return -1;
      }
    }
    if (*bit_size < 0) {
      *bit_size = *(long *)(sub_cursor.stack[0x1f].bit_offset + 0x20) << 3;
    }
  }
  else {
    *bit_size = -1;
  }
  return 0;
}

Assistant:

int coda_mem_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_special)
    {
        coda_cursor sub_cursor = *cursor;

        if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
        {
            return -1;
        }
        return coda_cursor_get_bit_size(&sub_cursor, bit_size);
    }

    if (type->tag == tag_mem_data)
    {
        if (type->definition->format == coda_format_ascii)
        {
            if (coda_ascii_cursor_get_bit_size(cursor, bit_size) != 0)
            {
                return -1;
            }
        }
        else if (coda_bin_cursor_get_bit_size(cursor, bit_size) != 0)
        {
            return -1;
        }
        if (*bit_size < 0)
        {
            *bit_size = 8 * ((coda_mem_data *)type)->length;
        }
    }
    else
    {
        *bit_size = -1;
    }

    return 0;
}